

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_optimize_for.pb.cc
# Opt level: O2

void proto2_unittest::TestOptimizedForSize::SharedDtor(MessageLite *self)

{
  ForeignMessage *this;
  ulong uVar1;
  LogMessageFatal local_20;
  
  google::protobuf::internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>
            (&self->_internal_metadata_);
  uVar1 = (self->_internal_metadata_).ptr_;
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    this = (ForeignMessage *)self[3]._vptr_MessageLite;
    if (this != (ForeignMessage *)0x0) {
      proto2_unittest::ForeignMessage::~ForeignMessage(this);
    }
    operator_delete(this,0x20);
    if ((int)self[4]._internal_metadata_.ptr_ != 0) {
      clear_foo((TestOptimizedForSize *)self);
    }
    google::protobuf::internal::ExtensionSet::~ExtensionSet((ExtensionSet *)(self + 1));
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/unittest_optimize_for.pb.cc"
             ,0x11a,"this_.GetArena() == nullptr");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
}

Assistant:

inline void TestOptimizedForSize::SharedDtor(MessageLite& self) {
  TestOptimizedForSize& this_ = static_cast<TestOptimizedForSize&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  delete this_._impl_.msg_;
  if (this_.has_foo()) {
    this_.clear_foo();
  }
  this_._impl_.~Impl_();
}